

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStream.cpp
# Opt level: O0

bool FileStream_SetCallback
               (TFileStream *pStream,STREAM_DOWNLOAD_CALLBACK pfnCallback,void *pvUserData)

{
  bool bVar1;
  TBlockStream *pBlockStream;
  void *pvUserData_local;
  STREAM_DOWNLOAD_CALLBACK pfnCallback_local;
  TFileStream *pStream_local;
  
  bVar1 = pStream->BlockRead != (BLOCK_READ)0x0;
  if (bVar1) {
    pStream[1].StreamRead = (STREAM_READ)pfnCallback;
    pStream[1].StreamResize = (STREAM_RESIZE)pvUserData;
  }
  else {
    SetLastError(0x5f);
  }
  return bVar1;
}

Assistant:

bool FileStream_SetCallback(TFileStream * pStream, STREAM_DOWNLOAD_CALLBACK pfnCallback, void * pvUserData)
{
    TBlockStream * pBlockStream = (TBlockStream *)pStream;

    if(pStream->BlockRead == NULL)
    {
        SetLastError(ERROR_NOT_SUPPORTED);
        return false;
    }

    pBlockStream->pfnCallback = pfnCallback;
    pBlockStream->UserData = pvUserData;
    return true;
}